

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# draco_index_type.h
# Opt level: O1

bool __thiscall
draco::MeshEdgebreakerEncoderImpl<draco::MeshEdgebreakerTraversalValenceEncoder>::IsRightFaceVisited
          (MeshEdgebreakerEncoderImpl<draco::MeshEdgebreakerTraversalValenceEncoder> *this,
          CornerIndex corner_id)

{
  CornerIndex CVar1;
  
  CVar1.value_ = corner_id.value_;
  if (corner_id.value_ != 0xffffffff) {
    CVar1.value_ = corner_id.value_ - 2;
    if (0x55555555 < (corner_id.value_ + 1) * -0x55555555) {
      CVar1.value_ = corner_id.value_ + 1;
    }
  }
  if (CVar1.value_ != 0xffffffff) {
    CVar1.value_ = *(uint *)(*(long *)&(((this->corner_table_)._M_t.
                                         super___uniq_ptr_impl<draco::CornerTable,_std::default_delete<draco::CornerTable>_>
                                         ._M_t.
                                         super__Tuple_impl<0UL,_draco::CornerTable_*,_std::default_delete<draco::CornerTable>_>
                                         .super__Head_base<0UL,_draco::CornerTable_*,_false>.
                                        _M_head_impl)->opposite_corners_).vector_.
                                       super__Vector_base<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>_>_>
                            + (ulong)CVar1.value_ * 4);
  }
  if (CVar1.value_ != 0xffffffff) {
    return (*(ulong *)((long)(this->visited_faces_).super__Bvector_base<std::allocator<bool>_>.
                             _M_impl.super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p
                      + (ulong)(CVar1.value_ / 0x18 & 0xfffffff8)) >>
            ((ulong)CVar1.value_ / 3 & 0x3f) & 1) != 0;
  }
  return true;
}

Assistant:

constexpr bool operator==(const IndexType &i) const {
    return value_ == i.value_;
  }